

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void fdct8x16_new_avx2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [32];
  undefined1 (*pauVar7) [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  char in_DL;
  long in_RSI;
  undefined1 (*in_RDI) [32];
  __m256i x5 [4];
  __m256i x4 [8];
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m256i x3 [8];
  __m256i x2 [8];
  __m256i x1 [8];
  __m256i x [8];
  __m256i cospi_arr [12];
  __m128i cospi_m52_p12;
  __m128i cospi_p12_p52;
  __m128i cospi_m20_p44;
  __m128i cospi_p44_p20;
  __m128i cospi_m36_p28;
  __m128i cospi_p28_p36;
  __m128i cospi_m04_p60;
  __m128i cospi_p60_p04;
  __m128i cospi_m40_p24;
  __m128i cospi_p24_p40;
  __m128i cospi_m08_p56;
  __m128i cospi_p56_p08;
  __m128i cospi_m48_m16;
  __m128i cospi_m16_p48;
  __m128i cospi_p48_p16;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_m32_p32;
  __m256i in1;
  __m256i in0;
  __m128i temp3;
  __m128i temp2;
  __m128i temp1;
  __m128i temp0;
  __m128i __rounding;
  __m256i __rounding_256;
  int32_t *cospi;
  int8_t *in_stack_ffffffffffffe900;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 local_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 local_1530;
  undefined8 uStack_1528;
  __m128i *local_1520;
  __m128i *out1;
  undefined1 in_stack_ffffffffffffeaf0 [16];
  undefined1 auVar34 [16];
  undefined1 in_stack_ffffffffffffeb00 [16];
  undefined1 auVar35 [16];
  __m256i *in_stack_ffffffffffffeb10;
  __m256i *w0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 local_1490;
  undefined8 uStack_1488;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  longlong local_d90;
  longlong lStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined1 local_d70 [16];
  undefined1 local_d60 [16];
  undefined8 local_d50;
  undefined8 uStack_d48;
  longlong local_d40;
  longlong lStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  int32_t *local_d20;
  char local_d11;
  long local_d10;
  undefined1 (*local_d08) [32];
  uint local_cfc;
  uint local_cf8;
  uint local_cf4;
  uint local_cf0;
  uint local_cec;
  uint local_ce8;
  uint local_ce4;
  uint local_ce0;
  uint local_cdc;
  uint local_cd8;
  uint local_cd4;
  uint local_cd0;
  uint local_ccc;
  uint local_cc8;
  uint local_cc4;
  uint local_cc0;
  uint local_cbc;
  uint local_cb8;
  uint local_cb4;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  uint local_b64;
  undefined8 local_b60;
  __m128i *palStack_b58;
  uint local_b44;
  __m128i *local_b40;
  __m256i *palStack_b38;
  uint local_b24;
  __m256i *local_b20;
  __m256i *palStack_b18;
  uint local_b04;
  __m256i *local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined1 local_ab0 [16];
  uint local_aa0;
  uint local_a9c;
  uint local_a98;
  uint local_a94;
  undefined1 local_a90 [16];
  uint local_a80;
  uint local_a7c;
  uint local_a78;
  uint local_a74;
  undefined1 local_a70 [16];
  uint local_a60;
  uint local_a5c;
  uint local_a58;
  uint local_a54;
  undefined1 local_a50 [16];
  uint local_a40;
  uint local_a3c;
  uint local_a38;
  uint local_a34;
  undefined1 local_a30 [16];
  uint local_a20;
  uint local_a1c;
  uint local_a18;
  uint local_a14;
  undefined1 local_a10 [16];
  uint local_a00;
  uint local_9fc;
  uint local_9f8;
  uint local_9f4;
  undefined1 local_9f0 [16];
  uint local_9e0;
  uint local_9dc;
  uint local_9d8;
  uint local_9d4;
  undefined1 local_9d0 [16];
  uint local_9c0;
  uint local_9bc;
  uint local_9b8;
  uint local_9b4;
  undefined1 local_9b0 [16];
  uint local_9a0;
  uint local_99c;
  uint local_998;
  uint local_994;
  undefined1 local_990 [16];
  uint local_980;
  uint local_97c;
  uint local_978;
  uint local_974;
  undefined1 local_970 [16];
  uint local_960;
  uint local_95c;
  uint local_958;
  uint local_954;
  undefined1 local_950 [16];
  uint local_940;
  uint local_93c;
  uint local_938;
  uint local_934;
  undefined1 local_930 [16];
  uint local_920;
  uint local_91c;
  uint local_918;
  uint local_914;
  undefined1 local_910 [16];
  uint local_900;
  uint local_8fc;
  uint local_8f8;
  uint local_8f4;
  undefined1 local_8f0 [16];
  uint local_8e0;
  uint local_8dc;
  uint local_8d8;
  uint local_8d4;
  undefined1 local_8d0 [16];
  uint local_8c0;
  uint local_8bc;
  uint local_8b8;
  uint local_8b4;
  undefined1 local_8b0 [16];
  uint local_8a0;
  uint local_89c;
  uint local_898;
  uint local_894;
  undefined1 local_890 [16];
  uint local_880;
  uint local_87c;
  uint local_878;
  uint local_874;
  undefined1 local_870 [16];
  uint local_860;
  uint local_85c;
  uint local_858;
  uint local_854;
  longlong local_850;
  longlong lStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  longlong local_820;
  longlong lStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  longlong local_6c0;
  longlong lStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  longlong local_600;
  longlong lStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  uint local_364;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  uint local_340;
  uint local_33c;
  uint local_338;
  uint local_334;
  uint local_330;
  uint local_32c;
  uint local_328;
  uint local_324;
  longlong local_320;
  longlong lStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  longlong local_260;
  longlong lStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  
  local_d11 = in_DL;
  local_d10 = in_RSI;
  local_d08 = in_RDI;
  local_d20 = ::cospi_arr((int)in_DL);
  local_364 = 1 << (local_d11 - 1U & 0x1f);
  auVar8 = vpinsrd_avx(ZEXT416(local_364),local_364,1);
  auVar8 = vpinsrd_avx(auVar8,local_364,2);
  local_360 = vpinsrd_avx(auVar8,local_364,3);
  auVar8 = vpinsrd_avx(ZEXT416(local_364),local_364,1);
  auVar8 = vpinsrd_avx(auVar8,local_364,2);
  auStack_350 = vpinsrd_avx(auVar8,local_364,3);
  local_d40 = local_360._0_8_;
  lStack_d38 = local_360._8_8_;
  uStack_d30 = auStack_350._0_8_;
  uStack_d28 = auStack_350._8_8_;
  local_cb4 = 1 << (local_d11 - 1U & 0x1f);
  auVar8 = vpinsrd_avx(ZEXT416(local_cb4),local_cb4,1);
  auVar8 = vpinsrd_avx(auVar8,local_cb4,2);
  local_ab0 = vpinsrd_avx(auVar8,local_cb4,3);
  local_d50 = local_ab0._0_8_;
  uStack_d48 = local_ab0._8_8_;
  local_cb8 = -local_d20[0x20] & 0xffffU | local_d20[0x20] << 0x10;
  auVar8 = vpinsrd_avx(ZEXT416(local_cb8),local_cb8,1);
  auVar8 = vpinsrd_avx(auVar8,local_cb8,2);
  auVar8 = vpinsrd_avx(auVar8,local_cb8,3);
  local_a90._0_8_ = auVar8._0_8_;
  uVar30 = local_a90._0_8_;
  local_a90._8_8_ = auVar8._8_8_;
  uVar31 = local_a90._8_8_;
  local_cbc = CONCAT22((short)local_d20[0x20],(short)local_d20[0x20]);
  auVar35 = vpinsrd_avx(ZEXT416(local_cbc),local_cbc,1);
  auVar35 = vpinsrd_avx(auVar35,local_cbc,2);
  auVar35 = vpinsrd_avx(auVar35,local_cbc,3);
  local_a70._0_8_ = auVar35._0_8_;
  uVar32 = local_a70._0_8_;
  local_a70._8_8_ = auVar35._8_8_;
  uVar33 = local_a70._8_8_;
  local_cc0 = (local_d20[0x20] & 0xffffU) + local_d20[0x20] * -0x10000;
  auVar34 = vpinsrd_avx(ZEXT416(local_cc0),local_cc0,1);
  auVar34 = vpinsrd_avx(auVar34,local_cc0,2);
  local_a50 = vpinsrd_avx(auVar34,local_cc0,3);
  local_cc4 = (uint)*(ushort *)(local_d20 + 0x30) | local_d20[0x10] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_cc4),local_cc4,1);
  auVar34 = vpinsrd_avx(auVar34,local_cc4,2);
  local_a30 = vpinsrd_avx(auVar34,local_cc4,3);
  local_cc8 = -local_d20[0x10] & 0xffffU | local_d20[0x30] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_cc8),local_cc8,1);
  auVar34 = vpinsrd_avx(auVar34,local_cc8,2);
  local_a10 = vpinsrd_avx(auVar34,local_cc8,3);
  local_ccc = (-local_d20[0x30] & 0xffffU) + local_d20[0x10] * -0x10000;
  auVar34 = vpinsrd_avx(ZEXT416(local_ccc),local_ccc,1);
  auVar34 = vpinsrd_avx(auVar34,local_ccc,2);
  local_9f0 = vpinsrd_avx(auVar34,local_ccc,3);
  local_cd0 = (uint)*(ushort *)(local_d20 + 0x38) | local_d20[8] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_cd0),local_cd0,1);
  auVar34 = vpinsrd_avx(auVar34,local_cd0,2);
  local_9d0 = vpinsrd_avx(auVar34,local_cd0,3);
  local_cd4 = -local_d20[8] & 0xffffU | local_d20[0x38] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_cd4),local_cd4,1);
  auVar34 = vpinsrd_avx(auVar34,local_cd4,2);
  local_9b0 = vpinsrd_avx(auVar34,local_cd4,3);
  local_cd8 = (uint)*(ushort *)(local_d20 + 0x18) | local_d20[0x28] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_cd8),local_cd8,1);
  auVar34 = vpinsrd_avx(auVar34,local_cd8,2);
  local_990 = vpinsrd_avx(auVar34,local_cd8,3);
  local_cdc = -local_d20[0x28] & 0xffffU | local_d20[0x18] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_cdc),local_cdc,1);
  auVar34 = vpinsrd_avx(auVar34,local_cdc,2);
  local_970 = vpinsrd_avx(auVar34,local_cdc,3);
  local_ce0 = (uint)*(ushort *)(local_d20 + 0x3c) | local_d20[4] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_ce0),local_ce0,1);
  auVar34 = vpinsrd_avx(auVar34,local_ce0,2);
  local_950 = vpinsrd_avx(auVar34,local_ce0,3);
  local_ce4 = -local_d20[4] & 0xffffU | local_d20[0x3c] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_ce4),local_ce4,1);
  auVar34 = vpinsrd_avx(auVar34,local_ce4,2);
  local_930 = vpinsrd_avx(auVar34,local_ce4,3);
  local_ce8 = (uint)*(ushort *)(local_d20 + 0x1c) | local_d20[0x24] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_ce8),local_ce8,1);
  auVar34 = vpinsrd_avx(auVar34,local_ce8,2);
  local_910 = vpinsrd_avx(auVar34,local_ce8,3);
  local_cec = -local_d20[0x24] & 0xffffU | local_d20[0x1c] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_cec),local_cec,1);
  auVar34 = vpinsrd_avx(auVar34,local_cec,2);
  local_8f0 = vpinsrd_avx(auVar34,local_cec,3);
  local_cf0 = (uint)*(ushort *)(local_d20 + 0x2c) | local_d20[0x14] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_cf0),local_cf0,1);
  auVar34 = vpinsrd_avx(auVar34,local_cf0,2);
  local_8d0 = vpinsrd_avx(auVar34,local_cf0,3);
  local_cf4 = -local_d20[0x14] & 0xffffU | local_d20[0x2c] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_cf4),local_cf4,1);
  auVar34 = vpinsrd_avx(auVar34,local_cf4,2);
  local_8b0 = vpinsrd_avx(auVar34,local_cf4,3);
  local_cf8 = (uint)*(ushort *)(local_d20 + 0xc) | local_d20[0x34] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_cf8),local_cf8,1);
  auVar34 = vpinsrd_avx(auVar34,local_cf8,2);
  local_890 = vpinsrd_avx(auVar34,local_cf8,3);
  local_cfc = -local_d20[0x34] & 0xffffU | local_d20[0xc] << 0x10;
  auVar34 = vpinsrd_avx(ZEXT416(local_cfc),local_cfc,1);
  auVar34 = vpinsrd_avx(auVar34,local_cfc,2);
  local_870 = vpinsrd_avx(auVar34,local_cfc,3);
  local_6d0 = local_a90._0_8_;
  uStack_6c8 = local_a90._8_8_;
  local_6e0 = local_a70._0_8_;
  uStack_6d8 = local_a70._8_8_;
  local_6f0 = local_a70._0_8_;
  uStack_6e8 = local_a70._8_8_;
  local_700 = local_a50._0_8_;
  uStack_6f8 = local_a50._8_8_;
  local_710 = local_a10._0_8_;
  uStack_708 = local_a10._8_8_;
  local_720 = local_a30._0_8_;
  uStack_718 = local_a30._8_8_;
  local_730 = local_9d0._0_8_;
  uStack_728 = local_9d0._8_8_;
  local_740 = local_9b0._0_8_;
  uStack_738 = local_9b0._8_8_;
  local_750 = local_950._0_8_;
  uStack_748 = local_950._8_8_;
  local_760 = local_930._0_8_;
  uStack_758 = local_930._8_8_;
  local_770 = local_8d0._0_8_;
  uStack_768 = local_8d0._8_8_;
  local_780 = local_8b0._0_8_;
  uStack_778 = local_8b0._8_8_;
  local_790 = *(undefined8 *)*local_d08;
  uStack_788 = *(undefined8 *)(*local_d08 + 8);
  uStack_3d0 = *(undefined8 *)(*local_d08 + 0x10);
  uStack_3c8 = *(undefined8 *)(*local_d08 + 0x18);
  pauVar4 = (undefined1 (*) [16])(local_d08[7] + 0x10);
  local_7a0 = *(undefined8 *)*pauVar4;
  uStack_798 = *(undefined8 *)(local_d08[7] + 0x18);
  uStack_3f0 = *(undefined8 *)local_d08[7];
  uStack_3e8 = *(undefined8 *)(local_d08[7] + 8);
  pauVar1 = local_d08 + 1;
  local_7b0 = *(undefined8 *)*pauVar1;
  uStack_7a8 = *(undefined8 *)(local_d08[1] + 8);
  uStack_410 = *(undefined8 *)(local_d08[1] + 0x10);
  uStack_408 = *(undefined8 *)(local_d08[1] + 0x18);
  pauVar5 = (undefined1 (*) [16])(local_d08[6] + 0x10);
  local_7c0 = *(undefined8 *)*pauVar5;
  uStack_7b8 = *(undefined8 *)(local_d08[6] + 0x18);
  uStack_430 = *(undefined8 *)local_d08[6];
  uStack_428 = *(undefined8 *)(local_d08[6] + 8);
  pauVar2 = (undefined1 (*) [16])(local_d08[2] + 0x10);
  local_7d0 = *(undefined8 *)*pauVar2;
  uStack_7c8 = *(undefined8 *)(local_d08[2] + 0x18);
  uStack_450 = *(undefined8 *)local_d08[2];
  uStack_448 = *(undefined8 *)(local_d08[2] + 8);
  pauVar6 = local_d08 + 5;
  local_7e0 = *(undefined8 *)*pauVar6;
  uStack_7d8 = *(undefined8 *)(local_d08[5] + 8);
  uStack_470 = *(undefined8 *)(local_d08[5] + 0x10);
  uStack_468 = *(undefined8 *)(local_d08[5] + 0x18);
  pauVar3 = (undefined1 (*) [16])(local_d08[3] + 0x10);
  local_7f0 = *(undefined8 *)*pauVar3;
  uStack_7e8 = *(undefined8 *)(local_d08[3] + 0x18);
  uStack_490 = *(undefined8 *)local_d08[3];
  uStack_488 = *(undefined8 *)(local_d08[3] + 8);
  pauVar7 = local_d08 + 4;
  local_800 = *(undefined8 *)*pauVar7;
  uStack_7f8 = *(undefined8 *)(local_d08[4] + 8);
  uStack_4b0 = *(undefined8 *)(local_d08[4] + 0x10);
  uStack_4a8 = *(undefined8 *)(local_d08[4] + 0x18);
  auVar17._16_8_ = uStack_3f0;
  auVar17._0_16_ = *pauVar4;
  auVar17._24_8_ = uStack_3e8;
  auVar12 = vpaddsw_avx2(*local_d08,auVar17);
  auVar29._16_8_ = uStack_3f0;
  auVar29._0_16_ = *pauVar4;
  auVar29._24_8_ = uStack_3e8;
  auVar17 = vpsubsw_avx2(*local_d08,auVar29);
  auVar20._16_8_ = uStack_430;
  auVar20._0_16_ = *pauVar5;
  auVar20._24_8_ = uStack_428;
  auVar13 = vpaddsw_avx2(*pauVar1,auVar20);
  auVar28._16_8_ = uStack_430;
  auVar28._0_16_ = *pauVar5;
  auVar28._24_8_ = uStack_428;
  vpsubsw_avx2(*pauVar1,auVar28);
  auVar19._16_8_ = uStack_450;
  auVar19._0_16_ = *pauVar2;
  auVar19._24_8_ = uStack_448;
  auVar14 = vpaddsw_avx2(auVar19,*pauVar6);
  auVar27._16_8_ = uStack_450;
  auVar27._0_16_ = *pauVar2;
  auVar27._24_8_ = uStack_448;
  vpsubsw_avx2(auVar27,*pauVar6);
  auVar18._16_8_ = uStack_490;
  auVar18._0_16_ = *pauVar3;
  auVar18._24_8_ = uStack_488;
  auVar15 = vpaddsw_avx2(auVar18,*pauVar7);
  auVar26._16_8_ = uStack_490;
  auVar26._0_16_ = *pauVar3;
  auVar26._24_8_ = uStack_488;
  auVar18 = vpsubsw_avx2(auVar26,*pauVar7);
  local_1280 = auVar12._0_8_;
  uStack_1278 = auVar12._8_8_;
  uStack_1270 = auVar12._16_8_;
  uStack_1268 = auVar12._24_8_;
  local_1220 = auVar15._0_8_;
  uStack_1218 = auVar15._8_8_;
  uStack_1210 = auVar15._16_8_;
  uStack_1208 = auVar15._24_8_;
  local_4e0 = local_1280;
  uStack_4d8 = uStack_1278;
  uStack_4d0 = uStack_1270;
  uStack_4c8 = uStack_1268;
  local_500 = local_1220;
  uStack_4f8 = uStack_1218;
  uStack_4f0 = uStack_1210;
  uStack_4e8 = uStack_1208;
  auVar16 = vpaddsw_avx2(auVar12,auVar15);
  local_140 = local_1280;
  uStack_138 = uStack_1278;
  uStack_130 = uStack_1270;
  uStack_128 = uStack_1268;
  local_160 = local_1220;
  uStack_158 = uStack_1218;
  uStack_150 = uStack_1210;
  uStack_148 = uStack_1208;
  auVar15 = vpsubsw_avx2(auVar12,auVar15);
  local_1260 = auVar13._0_8_;
  uStack_1258 = auVar13._8_8_;
  uStack_1250 = auVar13._16_8_;
  uStack_1248 = auVar13._24_8_;
  local_1240 = auVar14._0_8_;
  uStack_1238 = auVar14._8_8_;
  uStack_1230 = auVar14._16_8_;
  uStack_1228 = auVar14._24_8_;
  local_520 = local_1260;
  uStack_518 = uStack_1258;
  uStack_510 = uStack_1250;
  uStack_508 = uStack_1248;
  local_540 = local_1240;
  uStack_538 = uStack_1238;
  uStack_530 = uStack_1230;
  uStack_528 = uStack_1228;
  auVar12 = vpaddsw_avx2(auVar13,auVar14);
  local_180 = local_1260;
  uStack_178 = uStack_1258;
  uStack_170 = uStack_1250;
  uStack_168 = uStack_1248;
  local_1a0 = local_1240;
  uStack_198 = uStack_1238;
  uStack_190 = uStack_1230;
  uStack_188 = uStack_1228;
  auVar13 = vpsubsw_avx2(auVar13,auVar14);
  local_1200 = auVar18._0_8_;
  uStack_11f8 = auVar18._8_8_;
  uStack_11f0 = auVar18._16_8_;
  uStack_11e8 = auVar18._24_8_;
  local_11a0 = auVar17._0_8_;
  uStack_1198 = auVar17._8_8_;
  uStack_1190 = auVar17._16_8_;
  uStack_1188 = auVar17._24_8_;
  local_aa0 = local_cb4;
  local_a9c = local_cb4;
  local_a98 = local_cb4;
  local_a94 = local_cb4;
  local_a90 = auVar8;
  local_a80 = local_cb8;
  local_a7c = local_cb8;
  local_a78 = local_cb8;
  local_a74 = local_cb8;
  local_a70 = auVar35;
  local_a60 = local_cbc;
  local_a5c = local_cbc;
  local_a58 = local_cbc;
  local_a54 = local_cbc;
  local_a40 = local_cc0;
  local_a3c = local_cc0;
  local_a38 = local_cc0;
  local_a34 = local_cc0;
  local_a20 = local_cc4;
  local_a1c = local_cc4;
  local_a18 = local_cc4;
  local_a14 = local_cc4;
  local_a00 = local_cc8;
  local_9fc = local_cc8;
  local_9f8 = local_cc8;
  local_9f4 = local_cc8;
  local_9e0 = local_ccc;
  local_9dc = local_ccc;
  local_9d8 = local_ccc;
  local_9d4 = local_ccc;
  local_9c0 = local_cd0;
  local_9bc = local_cd0;
  local_9b8 = local_cd0;
  local_9b4 = local_cd0;
  local_9a0 = local_cd4;
  local_99c = local_cd4;
  local_998 = local_cd4;
  local_994 = local_cd4;
  local_980 = local_cd8;
  local_97c = local_cd8;
  local_978 = local_cd8;
  local_974 = local_cd8;
  local_960 = local_cdc;
  local_95c = local_cdc;
  local_958 = local_cdc;
  local_954 = local_cdc;
  local_940 = local_ce0;
  local_93c = local_ce0;
  local_938 = local_ce0;
  local_934 = local_ce0;
  local_920 = local_ce4;
  local_91c = local_ce4;
  local_918 = local_ce4;
  local_914 = local_ce4;
  local_900 = local_ce8;
  local_8fc = local_ce8;
  local_8f8 = local_ce8;
  local_8f4 = local_ce8;
  local_8e0 = local_cec;
  local_8dc = local_cec;
  local_8d8 = local_cec;
  local_8d4 = local_cec;
  local_8c0 = local_cf0;
  local_8bc = local_cf0;
  local_8b8 = local_cf0;
  local_8b4 = local_cf0;
  local_8a0 = local_cf4;
  local_89c = local_cf4;
  local_898 = local_cf4;
  local_894 = local_cf4;
  local_880 = local_cf8;
  local_87c = local_cf8;
  local_878 = local_cf8;
  local_874 = local_cf8;
  local_860 = local_cfc;
  local_85c = local_cfc;
  local_858 = local_cfc;
  local_854 = local_cfc;
  local_4c0 = local_800;
  uStack_4b8 = uStack_7f8;
  local_4a0 = local_7f0;
  uStack_498 = uStack_7e8;
  local_480 = local_7e0;
  uStack_478 = uStack_7d8;
  local_460 = local_7d0;
  uStack_458 = uStack_7c8;
  local_440 = local_7c0;
  uStack_438 = uStack_7b8;
  local_420 = local_7b0;
  uStack_418 = uStack_7a8;
  local_400 = local_7a0;
  uStack_3f8 = uStack_798;
  local_3e0 = local_790;
  uStack_3d8 = uStack_788;
  local_340 = local_364;
  local_33c = local_364;
  local_338 = local_364;
  local_334 = local_364;
  local_330 = local_364;
  local_32c = local_364;
  local_328 = local_364;
  local_324 = local_364;
  local_120 = local_800;
  uStack_118 = uStack_7f8;
  uStack_110 = uStack_4b0;
  uStack_108 = uStack_4a8;
  local_100 = local_7f0;
  uStack_f8 = uStack_7e8;
  uStack_f0 = uStack_490;
  uStack_e8 = uStack_488;
  local_e0 = local_7e0;
  uStack_d8 = uStack_7d8;
  uStack_d0 = uStack_470;
  uStack_c8 = uStack_468;
  local_c0 = local_7d0;
  uStack_b8 = uStack_7c8;
  uStack_b0 = uStack_450;
  uStack_a8 = uStack_448;
  local_a0 = local_7c0;
  uStack_98 = uStack_7b8;
  uStack_90 = uStack_430;
  uStack_88 = uStack_428;
  local_80 = local_7b0;
  uStack_78 = uStack_7a8;
  uStack_70 = uStack_410;
  uStack_68 = uStack_408;
  local_60 = local_7a0;
  uStack_58 = uStack_798;
  uStack_50 = uStack_3f0;
  uStack_48 = uStack_3e8;
  local_40 = local_790;
  uStack_38 = uStack_788;
  uStack_30 = uStack_3d0;
  uStack_28 = uStack_3c8;
  btf_16_avx2(in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb00._8_8_,
              in_stack_ffffffffffffeb00._0_8_,in_stack_ffffffffffffeaf0._8_8_,
              in_stack_ffffffffffffeaf0._0_8_,local_1520,(__m128i *)&local_d90,(__m128i *)&local_d40
              ,(__m256i *)&local_d11,in_stack_ffffffffffffe900);
  local_810 = local_d80;
  uStack_808 = uStack_d78;
  uStack_5b0 = local_d60._0_8_;
  uStack_5a8 = local_d60._8_8_;
  local_820 = local_d90;
  lStack_818 = lStack_d88;
  uStack_5f0 = local_d70._0_8_;
  uStack_5e8 = local_d70._8_8_;
  auVar14 = vpermq_avx2(auVar12,0x4e);
  local_1380 = auVar16._0_8_;
  uStack_1378 = auVar16._8_8_;
  uStack_1370 = auVar16._16_8_;
  uStack_1368 = auVar16._24_8_;
  local_1360 = auVar14._0_8_;
  uStack_1358 = auVar14._8_8_;
  uStack_1350 = auVar14._16_8_;
  uStack_1348 = auVar14._24_8_;
  local_560 = local_1380;
  uStack_558 = uStack_1378;
  uStack_550 = uStack_1370;
  uStack_548 = uStack_1368;
  local_580 = local_1360;
  uStack_578 = uStack_1358;
  uStack_570 = uStack_1350;
  uStack_568 = uStack_1348;
  auVar12 = vpaddsw_avx2(auVar16,auVar14);
  local_1c0 = local_1380;
  uStack_1b8 = uStack_1378;
  uStack_1b0 = uStack_1370;
  uStack_1a8 = uStack_1368;
  local_1e0 = local_1360;
  uStack_1d8 = uStack_1358;
  uStack_1d0 = uStack_1350;
  uStack_1c8 = uStack_1348;
  auVar16 = vpsubsw_avx2(auVar16,auVar14);
  auVar19 = vpblendd_avx2(auVar15,auVar13,0xf0);
  local_12c0 = auVar13._0_8_;
  uStack_12b8 = auVar13._8_8_;
  uStack_12b0 = auVar13._16_8_;
  uStack_12a8 = auVar13._24_8_;
  local_3a0 = local_12c0;
  uStack_398 = uStack_12b8;
  uStack_390 = uStack_12b0;
  uStack_388 = uStack_12a8;
  uStack_1290 = auVar15._16_8_;
  uStack_1288 = auVar15._24_8_;
  local_ca0 = local_12c0;
  uStack_c98 = uStack_12b8;
  local_cb0 = uStack_1290;
  uStack_ca8 = uStack_1288;
  auVar11 = vpunpcklwd_avx(auVar13._0_16_,auVar15._16_16_);
  local_3c0 = local_12c0;
  uStack_3b8 = uStack_12b8;
  uStack_3b0 = uStack_12b0;
  uStack_3a8 = uStack_12a8;
  local_c80 = local_12c0;
  uStack_c78 = uStack_12b8;
  local_c90 = uStack_1290;
  uStack_c88 = uStack_1288;
  auVar10 = vpunpckhwd_avx(auVar13._0_16_,auVar15._16_16_);
  local_1490 = auVar11._0_8_;
  uStack_1488 = auVar11._8_8_;
  local_c00 = local_1490;
  uStack_bf8 = uStack_1488;
  local_c10 = uVar30;
  uStack_c08 = uVar31;
  auVar34 = vpmaddwd_avx(auVar11,auVar8);
  local_14a0 = auVar10._0_8_;
  uStack_1498 = auVar10._8_8_;
  local_c20 = local_14a0;
  uStack_c18 = uStack_1498;
  local_c30 = uVar30;
  uStack_c28 = uVar31;
  auVar9 = vpmaddwd_avx(auVar10,auVar8);
  local_c40 = local_1490;
  uStack_c38 = uStack_1488;
  local_c50 = uVar32;
  uStack_c48 = uVar33;
  auVar11 = vpmaddwd_avx(auVar11,auVar35);
  local_c60 = local_14a0;
  uStack_c58 = uStack_1498;
  local_c70 = uVar32;
  uStack_c68 = uVar33;
  auVar10 = vpmaddwd_avx(auVar10,auVar35);
  local_14b0 = auVar34._0_8_;
  uStack_14a8 = auVar34._8_8_;
  local_b80 = local_14b0;
  uStack_b78 = uStack_14a8;
  local_b90 = local_d50;
  uStack_b88 = uStack_d48;
  auVar8._8_8_ = uStack_d48;
  auVar8._0_8_ = local_d50;
  auVar8 = vpaddd_avx(auVar34,auVar8);
  local_14c0 = auVar9._0_8_;
  uStack_14b8 = auVar9._8_8_;
  local_ba0 = local_14c0;
  uStack_b98 = uStack_14b8;
  local_bb0 = local_d50;
  uStack_ba8 = uStack_d48;
  auVar35._8_8_ = uStack_d48;
  auVar35._0_8_ = local_d50;
  auVar35 = vpaddd_avx(auVar9,auVar35);
  local_14d0 = auVar11._0_8_;
  uStack_14c8 = auVar11._8_8_;
  local_bc0 = local_14d0;
  uStack_bb8 = uStack_14c8;
  local_bd0 = local_d50;
  uStack_bc8 = uStack_d48;
  auVar34._8_8_ = uStack_d48;
  auVar34._0_8_ = local_d50;
  auVar34 = vpaddd_avx(auVar11,auVar34);
  local_14e0 = auVar10._0_8_;
  uStack_14d8 = auVar10._8_8_;
  local_be0 = local_14e0;
  uStack_bd8 = uStack_14d8;
  local_bf0 = local_d50;
  uStack_be8 = uStack_d48;
  auVar9._8_8_ = uStack_d48;
  auVar9._0_8_ = local_d50;
  auVar9 = vpaddd_avx(auVar10,auVar9);
  w0 = auVar8._0_8_;
  uStack_14e8 = auVar8._8_8_;
  local_b04 = (uint)local_d11;
  uStack_af8 = uStack_14e8;
  auVar8 = vpsrad_avx(auVar8,ZEXT416(local_b04));
  local_b20 = auVar35._0_8_;
  palStack_b18 = auVar35._8_8_;
  local_b24 = (uint)local_d11;
  auVar11 = vpsrad_avx(auVar35,ZEXT416(local_b24));
  local_b40 = auVar34._0_8_;
  palStack_b38 = auVar34._8_8_;
  local_b44 = (uint)local_d11;
  auVar10 = vpsrad_avx(auVar34,ZEXT416(local_b44));
  local_1520 = auVar9._0_8_;
  out1 = auVar9._8_8_;
  local_b64 = (uint)local_d11;
  local_b60 = local_1520;
  auVar9 = vpsrad_avx(auVar9,ZEXT416(local_b64));
  local_1530 = auVar8._0_8_;
  uStack_1528 = auVar8._8_8_;
  local_1540 = auVar11._0_8_;
  uStack_1538 = auVar11._8_8_;
  local_ac0 = local_1530;
  uStack_ab8 = uStack_1528;
  local_ad0 = local_1540;
  uStack_ac8 = uStack_1538;
  local_d60 = vpackssdw_avx(auVar8,auVar11);
  local_1550 = auVar10._0_8_;
  uStack_1548 = auVar10._8_8_;
  local_1560 = auVar9._0_8_;
  uStack_1558 = auVar9._8_8_;
  local_ae0 = local_1550;
  uStack_ad8 = uStack_1548;
  local_af0 = local_1560;
  uStack_ae8 = uStack_1558;
  auVar8 = vpackssdw_avx(auVar10,auVar9);
  local_d70._0_8_ = auVar8._0_8_;
  uVar30 = local_d70._0_8_;
  local_d70._8_8_ = auVar8._8_8_;
  uVar31 = local_d70._8_8_;
  local_830 = local_d70._0_8_;
  uStack_828 = local_d70._8_8_;
  uVar32 = local_d60._0_8_;
  uVar33 = local_d60._8_8_;
  local_5a0 = local_1200;
  uStack_598 = uStack_11f8;
  uStack_590 = uStack_11f0;
  uStack_588 = uStack_11e8;
  local_5c0 = local_d80;
  uStack_5b8 = uStack_d78;
  auVar15._8_8_ = uStack_d78;
  auVar15._0_8_ = local_d80;
  auVar15._16_8_ = uStack_5b0;
  auVar15._24_8_ = uStack_5a8;
  auVar13 = vpaddsw_avx2(auVar18,auVar15);
  local_200 = local_1200;
  uStack_1f8 = uStack_11f8;
  uStack_1f0 = uStack_11f0;
  uStack_1e8 = uStack_11e8;
  local_220 = local_d80;
  uStack_218 = uStack_d78;
  uStack_210 = uStack_5b0;
  uStack_208 = uStack_5a8;
  auVar25._8_8_ = uStack_d78;
  auVar25._0_8_ = local_d80;
  auVar25._16_8_ = uStack_5b0;
  auVar25._24_8_ = uStack_5a8;
  auVar15 = vpsubsw_avx2(auVar18,auVar25);
  local_5e0 = local_11a0;
  uStack_5d8 = uStack_1198;
  uStack_5d0 = uStack_1190;
  uStack_5c8 = uStack_1188;
  local_600 = local_d90;
  lStack_5f8 = lStack_d88;
  auVar14._8_8_ = lStack_d88;
  auVar14._0_8_ = local_d90;
  auVar14._16_8_ = uStack_5f0;
  auVar14._24_8_ = uStack_5e8;
  auVar14 = vpaddsw_avx2(auVar17,auVar14);
  local_240 = local_11a0;
  uStack_238 = uStack_1198;
  uStack_230 = uStack_1190;
  uStack_228 = uStack_1188;
  local_260 = local_d90;
  lStack_258 = lStack_d88;
  uStack_250 = uStack_5f0;
  uStack_248 = uStack_5e8;
  auVar24._8_8_ = lStack_d88;
  auVar24._0_8_ = local_d90;
  auVar24._16_8_ = uStack_5f0;
  auVar24._24_8_ = uStack_5e8;
  auVar17 = vpsubsw_avx2(auVar17,auVar24);
  vpblendd_avx2(auVar12,auVar16,0xf0);
  vperm2i128_avx2(auVar12,auVar16,0x21);
  local_d70 = auVar8;
  palStack_b58 = out1;
  local_b00 = w0;
  btf_16_avx2(w0,palStack_b18,local_b20,palStack_b38,local_b40,out1,(__m128i *)(local_d10 + 0xc0),
              (__m128i *)&local_d40,(__m256i *)&local_d11,in_stack_ffffffffffffe900);
  local_1440 = auVar19._0_8_;
  uStack_1438 = auVar19._8_8_;
  uStack_1430 = auVar19._16_8_;
  uStack_1428 = auVar19._24_8_;
  local_620 = local_1440;
  uStack_618 = uStack_1438;
  uStack_610 = uStack_1430;
  uStack_608 = uStack_1428;
  local_640 = uVar30;
  uStack_638 = uVar31;
  uStack_630 = uVar32;
  uStack_628 = uVar33;
  auVar16._16_8_ = uVar32;
  auVar16._0_16_ = auVar8;
  auVar16._24_8_ = uVar33;
  auVar12 = vpaddsw_avx2(auVar19,auVar16);
  local_280 = local_1440;
  uStack_278 = uStack_1438;
  uStack_270 = uStack_1430;
  uStack_268 = uStack_1428;
  local_2a0 = uVar30;
  uStack_298 = uVar31;
  uStack_290 = uVar32;
  uStack_288 = uVar33;
  auVar23._16_8_ = uVar32;
  auVar23._0_16_ = auVar8;
  auVar23._24_8_ = uVar33;
  auVar16 = vpsubsw_avx2(auVar19,auVar23);
  auVar18 = vperm2i128_avx2(auVar13,auVar15,0x20);
  auVar19 = vperm2i128_avx2(auVar17,auVar14,0x20);
  vperm2i128_avx2(auVar13,auVar15,0x31);
  vperm2i128_avx2(auVar14,auVar17,0x31);
  btf_16_avx2(w0,auVar35._8_8_,auVar35._0_8_,auVar34._8_8_,auVar34._0_8_,out1,(__m128i *)&local_d90,
              (__m128i *)&local_d40,(__m256i *)&local_d11,in_stack_ffffffffffffe900);
  auVar8 = local_d60;
  uVar32 = local_d60._0_8_;
  uVar33 = local_d60._8_8_;
  local_840 = local_d60._0_8_;
  uStack_838 = local_d60._8_8_;
  local_850 = local_d90;
  lStack_848 = lStack_d88;
  uVar30 = local_d70._0_8_;
  uVar31 = local_d70._8_8_;
  vperm2i128_avx2(auVar12,auVar16,0x31);
  vperm2i128_avx2(auVar12,auVar16,0x20);
  btf_16_avx2(w0,auVar35._8_8_,auVar35._0_8_,auVar34._8_8_,auVar34._0_8_,out1,
              (__m128i *)(local_d10 + 0x60),(__m128i *)&local_d40,(__m256i *)&local_d11,
              in_stack_ffffffffffffe900);
  local_15e0 = auVar18._0_8_;
  uStack_15d8 = auVar18._8_8_;
  uStack_15d0 = auVar18._16_8_;
  uStack_15c8 = auVar18._24_8_;
  local_660 = local_15e0;
  uStack_658 = uStack_15d8;
  uStack_650 = uStack_15d0;
  uStack_648 = uStack_15c8;
  local_680 = uVar32;
  uStack_678 = uVar33;
  uStack_670 = local_d80;
  uStack_668 = uStack_d78;
  auVar12._16_8_ = local_d80;
  auVar12._0_16_ = auVar8;
  auVar12._24_8_ = uStack_d78;
  auVar12 = vpaddsw_avx2(auVar18,auVar12);
  local_2c0 = local_15e0;
  uStack_2b8 = uStack_15d8;
  uStack_2b0 = uStack_15d0;
  uStack_2a8 = uStack_15c8;
  local_2e0 = uVar32;
  uStack_2d8 = uVar33;
  uStack_2d0 = local_d80;
  uStack_2c8 = uStack_d78;
  auVar22._16_8_ = local_d80;
  auVar22._0_16_ = auVar8;
  auVar22._24_8_ = uStack_d78;
  auVar14 = vpsubsw_avx2(auVar18,auVar22);
  local_15c0 = auVar19._0_8_;
  uStack_15b8 = auVar19._8_8_;
  uStack_15b0 = auVar19._16_8_;
  uStack_15a8 = auVar19._24_8_;
  local_6a0 = local_15c0;
  uStack_698 = uStack_15b8;
  uStack_690 = uStack_15b0;
  uStack_688 = uStack_15a8;
  local_6c0 = local_d90;
  lStack_6b8 = lStack_d88;
  uStack_6b0 = uVar30;
  uStack_6a8 = uVar31;
  auVar13._8_8_ = lStack_d88;
  auVar13._0_8_ = local_d90;
  auVar13._16_8_ = uVar30;
  auVar13._24_8_ = uVar31;
  auVar13 = vpaddsw_avx2(auVar19,auVar13);
  local_300 = local_15c0;
  uStack_2f8 = uStack_15b8;
  uStack_2f0 = uStack_15b0;
  uStack_2e8 = uStack_15a8;
  local_320 = local_d90;
  lStack_318 = lStack_d88;
  uStack_310 = uVar30;
  uStack_308 = uVar31;
  auVar21._8_8_ = lStack_d88;
  auVar21._0_8_ = local_d90;
  auVar21._16_8_ = uVar30;
  auVar21._24_8_ = uVar31;
  auVar15 = vpsubsw_avx2(auVar19,auVar21);
  vperm2i128_avx2(auVar12,auVar14,0x20);
  vperm2i128_avx2(auVar13,auVar15,0x31);
  btf_16_avx2(w0,auVar35._8_8_,auVar35._0_8_,auVar34._8_8_,auVar34._0_8_,out1,
              (__m128i *)(local_d10 + 0x70),(__m128i *)&local_d40,(__m256i *)&local_d11,
              in_stack_ffffffffffffe900);
  vperm2i128_avx2(auVar14,auVar12,0x31);
  vperm2i128_avx2(auVar15,auVar13,0x20);
  btf_16_avx2(w0,auVar35._8_8_,auVar35._0_8_,auVar34._8_8_,auVar34._0_8_,out1,
              (__m128i *)(local_d10 + 0x30),(__m128i *)&local_d40,(__m256i *)&local_d11,
              in_stack_ffffffffffffe900);
  return;
}

Assistant:

static inline void fdct8x16_new_avx2(const __m128i *input, __m128i *output,
                                     int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __rounding_256 = _mm256_set1_epi32(1 << (cos_bit - 1));
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));
  __m128i temp0, temp1, temp2, temp3;
  __m256i in0, in1;
  __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  __m128i cospi_p24_p40 = pair_set_epi16(cospi[24], cospi[40]);
  __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);
  __m128i cospi_p60_p04 = pair_set_epi16(cospi[60], cospi[4]);
  __m128i cospi_m04_p60 = pair_set_epi16(-cospi[4], cospi[60]);
  __m128i cospi_p28_p36 = pair_set_epi16(cospi[28], cospi[36]);
  __m128i cospi_m36_p28 = pair_set_epi16(-cospi[36], cospi[28]);
  __m128i cospi_p44_p20 = pair_set_epi16(cospi[44], cospi[20]);
  __m128i cospi_m20_p44 = pair_set_epi16(-cospi[20], cospi[44]);
  __m128i cospi_p12_p52 = pair_set_epi16(cospi[12], cospi[52]);
  __m128i cospi_m52_p12 = pair_set_epi16(-cospi[52], cospi[12]);

  __m256i cospi_arr[12];

  cospi_arr[0] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m32_p32),
                                         cospi_m32_p32, 0x1);
  cospi_arr[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_p32),
                                         cospi_p32_p32, 0x1);
  cospi_arr[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_p32),
                                         cospi_p48_p16, 0x1);
  cospi_arr[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_m32),
                                         cospi_m16_p48, 0x1);
  cospi_arr[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m16_p48),
                                         cospi_m48_m16, 0x1);
  cospi_arr[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p48_p16),
                                         cospi_m16_p48, 0x1);
  cospi_arr[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p56_p08),
                                         cospi_p24_p40, 0x1);
  cospi_arr[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m08_p56),
                                         cospi_m40_p24, 0x1);
  cospi_arr[8] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p60_p04),
                                         cospi_p28_p36, 0x1);
  cospi_arr[9] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m04_p60),
                                         cospi_m36_p28, 0x1);
  cospi_arr[10] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p44_p20),
                                          cospi_p12_p52, 0x1);
  cospi_arr[11] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m20_p44),
                                          cospi_m52_p12, 0x1);

  __m256i x[8];
  x[0] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[0]), input[1], 0x1);
  x[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(input[15]), input[14],
                                 0x1);
  x[2] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[2]), input[3], 0x1);
  x[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(input[13]), input[12],
                                 0x1);
  x[4] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[5]), input[4], 0x1);
  x[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(input[10]), input[11],
                                 0x1);
  x[6] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[7]), input[6], 0x1);
  x[7] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[8]), input[9], 0x1);

  // stage 1
  __m256i x1[8];
  x1[0] = _mm256_adds_epi16(x[0], x[1]);
  x1[7] = _mm256_subs_epi16(x[0], x[1]);
  x1[1] = _mm256_adds_epi16(x[2], x[3]);
  x1[6] = _mm256_subs_epi16(x[2], x[3]);
  x1[2] = _mm256_adds_epi16(x[4], x[5]);
  x1[5] = _mm256_subs_epi16(x[4], x[5]);
  x1[3] = _mm256_adds_epi16(x[6], x[7]);
  x1[4] = _mm256_subs_epi16(x[6], x[7]);

  // stage 2
  __m256i x2[8];
  x2[0] = _mm256_adds_epi16(x1[0], x1[3]);
  x2[7] = _mm256_subs_epi16(x1[0], x1[3]);
  x2[1] = _mm256_adds_epi16(x1[1], x1[2]);
  x2[6] = _mm256_subs_epi16(x1[1], x1[2]);
  x2[2] = x1[4];
  x2[3] = x1[7];
  btf_16_avx2(&cospi_arr[0], &cospi_arr[1], &x1[5], &x1[6], &temp0, &temp1,
              &temp2, &temp3, &__rounding_256, &cos_bit);
  x2[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp0, 0x1);
  x2[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp3), temp1, 0x1);

  // stage 3
  __m256i x3[8];
  x2[1] = _mm256_permute4x64_epi64(x2[1], 0x4e);
  x3[0] = _mm256_adds_epi16(x2[0], x2[1]);
  x3[1] = _mm256_subs_epi16(x2[0], x2[1]);
  x3[2] = _mm256_blend_epi32(x2[7], x2[6], 0xf0);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, _mm256_castsi256_si128(x2[6]),
              _mm256_extractf128_si256(x2[7], 0x01), temp0, temp1);
  x3[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp1), temp0, 0x1);
  x3[3] = _mm256_adds_epi16(x2[2], x2[4]);
  x3[4] = _mm256_subs_epi16(x2[2], x2[4]);
  x3[5] = _mm256_adds_epi16(x2[3], x2[5]);
  x3[6] = _mm256_subs_epi16(x2[3], x2[5]);

  // stage 4
  __m256i x4[8];
  x4[0] = _mm256_blend_epi32(x3[0], x3[1], 0xf0);
  x4[1] = _mm256_permute2f128_si256(x3[0], x3[1], 0x21);
  btf_16_avx2(&cospi_arr[2], &cospi_arr[3], &x4[0], &x4[1], &output[0],
              &output[8], &output[4], &output[12], &__rounding_256, &cos_bit);
  x4[2] = _mm256_adds_epi16(x3[2], x3[7]);
  x4[3] = _mm256_subs_epi16(x3[2], x3[7]);
  x4[4] = _mm256_permute2f128_si256(x3[3], x3[4], 0x20);
  x4[5] = _mm256_permute2f128_si256(x3[6], x3[5], 0x20);
  in0 = _mm256_permute2f128_si256(x3[3], x3[4], 0x31);
  in1 = _mm256_permute2f128_si256(x3[5], x3[6], 0x31);
  btf_16_avx2(&cospi_arr[4], &cospi_arr[5], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);

  x4[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp2, 0x1);
  x4[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp3), temp1, 0x1);

  // stage 5
  __m256i x5[4];
  in0 = _mm256_permute2f128_si256(x4[2], x4[3], 0x31);
  in1 = _mm256_permute2f128_si256(x4[2], x4[3], 0x20);
  btf_16_avx2(&cospi_arr[6], &cospi_arr[7], &in0, &in1, &output[2], &output[14],
              &output[10], &output[6], &__rounding_256, &cos_bit);
  x5[0] = _mm256_adds_epi16(x4[4], x4[6]);
  x5[1] = _mm256_subs_epi16(x4[4], x4[6]);
  x5[2] = _mm256_adds_epi16(x4[5], x4[7]);
  x5[3] = _mm256_subs_epi16(x4[5], x4[7]);

  // stage 6
  in0 = _mm256_permute2f128_si256(x5[0], x5[1], 0x20);
  in1 = _mm256_permute2f128_si256(x5[2], x5[3], 0x31);
  btf_16_avx2(&cospi_arr[8], &cospi_arr[9], &in0, &in1, &output[1], &output[15],
              &output[9], &output[7], &__rounding_256, &cos_bit);
  in0 = _mm256_permute2f128_si256(x5[1], x5[0], 0x31);
  in1 = _mm256_permute2f128_si256(x5[3], x5[2], 0x20);
  btf_16_avx2(&cospi_arr[10], &cospi_arr[11], &in0, &in1, &output[5],
              &output[11], &output[13], &output[3], &__rounding_256, &cos_bit);
}